

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

ggml_backend_sched_t
ggml_backend_sched_new
          (ggml_backend_t *backends,ggml_backend_buffer_type_t *bufts,int n_backends,
          size_t graph_size,_Bool parallel)

{
  ulong uVar1;
  ggml_backend_dev_t pgVar2;
  _func_ggml_backend_event_t_ggml_backend_dev_t *p_Var3;
  _Bool _Var4;
  ggml_backend_dev_type gVar5;
  int iVar6;
  ulong uVar7;
  ggml_backend_sched_t sched;
  char *pcVar8;
  int *piVar9;
  ggml_tensor **ppgVar10;
  size_t sVar11;
  ggml_backend_sched_split *pgVar12;
  ggml_backend_buffer_type_t pgVar13;
  ggml_backend_t pgVar14;
  ggml_backend_event_t pgVar15;
  ggml_gallocr_t pgVar16;
  size_t sVar17;
  ggml_backend_event_t (*papgVar18) [4];
  ulong uVar19;
  int c;
  ulong uVar20;
  ggml_hash_set local_48;
  
  if (n_backends < 1) {
    pcVar8 = "n_backends > 0";
    iVar6 = 0x5b0;
  }
  else if ((uint)n_backends < 0x11) {
    uVar7 = (ulong)(uint)n_backends;
    gVar5 = (*(backends[uVar7 - 1]->device->iface).get_type)(backends[uVar7 - 1]->device);
    if (gVar5 == GGML_BACKEND_DEVICE_TYPE_CPU) {
      sched = (ggml_backend_sched_t)calloc(1,0x448);
      pcVar8 = getenv("GGML_SCHED_DEBUG");
      if (pcVar8 == (char *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = atoi(pcVar8);
      }
      sched->debug = iVar6;
      sched->n_backends = n_backends;
      uVar1 = (ulong)parallel * 3 + 1;
      sched->n_copies = (int)uVar1;
      ggml_hash_set_new(&local_48,graph_size);
      (sched->hash_set).keys = local_48.keys;
      (sched->hash_set).size = local_48.size;
      (sched->hash_set).used = local_48.used;
      sVar11 = (sched->hash_set).size;
      piVar9 = (int *)malloc(sVar11 * 4);
      sched->hv_tensor_backend_ids = piVar9;
      ppgVar10 = (ggml_tensor **)malloc(sVar11 * uVar7 * 8 << (parallel * '\x02' & 0x3fU));
      sched->hv_tensor_copies = ppgVar10;
      sVar17 = graph_size * 0x15;
      piVar9 = (int *)calloc(sVar17,4);
      sched->node_backend_ids = piVar9;
      piVar9 = (int *)calloc(sVar17,4);
      sched->leaf_backend_ids = piVar9;
      piVar9 = (int *)calloc(sVar17,4);
      sched->prev_node_backend_ids = piVar9;
      piVar9 = (int *)calloc(sVar17,4);
      sched->prev_leaf_backend_ids = piVar9;
      uVar19 = 0;
      sVar11 = ggml_graph_overhead_custom(graph_size,false);
      sVar17 = graph_size * 0x1a40 + sVar11;
      sched->context_buffer_size = sVar17;
      pcVar8 = (char *)malloc(sVar17);
      sched->context_buffer = pcVar8;
      pgVar12 = (ggml_backend_sched_split *)calloc(0x10,0xb8);
      sched->splits = pgVar12;
      sched->splits_capacity = 0x10;
      papgVar18 = sched->events;
      while( true ) {
        pgVar14 = backends[uVar19];
        sched->backends[uVar19] = pgVar14;
        if (bufts == (ggml_backend_buffer_type_t *)0x0) {
          pgVar13 = (*(pgVar14->device->iface).get_buffer_type)(pgVar14->device);
          pgVar14 = backends[uVar19];
        }
        else {
          pgVar13 = bufts[uVar19];
        }
        sched->bufts[uVar19] = pgVar13;
        _Var4 = (*(pgVar14->device->iface).supports_buft)(pgVar14->device,pgVar13);
        if (!_Var4) break;
        if (parallel) {
          uVar20 = 0;
          do {
            pgVar2 = backends[uVar19]->device;
            if ((pgVar2 == (ggml_backend_dev_t)0x0) ||
               (p_Var3 = (pgVar2->iface).event_new,
               p_Var3 == (_func_ggml_backend_event_t_ggml_backend_dev_t *)0x0)) {
              pgVar15 = (ggml_backend_event_t)0x0;
            }
            else {
              pgVar15 = (*p_Var3)(pgVar2);
            }
            (*papgVar18)[uVar20] = pgVar15;
            uVar20 = uVar20 + 1;
          } while (uVar20 < uVar1);
        }
        uVar19 = uVar19 + 1;
        papgVar18 = papgVar18 + 1;
        if (uVar19 == uVar7) {
          pgVar16 = ggml_gallocr_new_n(sched->bufts,n_backends);
          sched->galloc = pgVar16;
          ggml_backend_sched_reset(sched);
          return sched;
        }
      }
      pcVar8 = "ggml_backend_supports_buft(backends[b], sched->bufts[b])";
      iVar6 = 0x5d2;
    }
    else {
      pcVar8 = 
      "ggml_backend_dev_type(ggml_backend_get_device(backends[n_backends - 1])) == GGML_BACKEND_DEVICE_TYPE_CPU"
      ;
      iVar6 = 0x5b2;
    }
  }
  else {
    pcVar8 = "n_backends <= GGML_SCHED_MAX_BACKENDS";
    iVar6 = 0x5b1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,iVar6,"GGML_ASSERT(%s) failed",pcVar8);
}

Assistant:

ggml_backend_sched_t ggml_backend_sched_new(
        ggml_backend_t * backends,
        ggml_backend_buffer_type_t * bufts,
        int n_backends,
        size_t graph_size,
        bool parallel) {
    GGML_ASSERT(n_backends > 0);
    GGML_ASSERT(n_backends <= GGML_SCHED_MAX_BACKENDS);
    GGML_ASSERT(ggml_backend_dev_type(ggml_backend_get_device(backends[n_backends - 1])) == GGML_BACKEND_DEVICE_TYPE_CPU);

    struct ggml_backend_sched * sched = (ggml_backend_sched *) calloc(1, sizeof(struct ggml_backend_sched));

    const char * GGML_SCHED_DEBUG = getenv("GGML_SCHED_DEBUG");
    sched->debug = GGML_SCHED_DEBUG ? atoi(GGML_SCHED_DEBUG) : 0;
    sched->n_backends = n_backends;
    sched->n_copies = parallel ? GGML_SCHED_MAX_COPIES : 1;

    // initialize hash table
    // FIXME: needs to be size*2 to account for leafs (do it in graph_split instead)
    sched->hash_set    = ggml_hash_set_new(graph_size);
    sched->hv_tensor_backend_ids = (int *) malloc(sched->hash_set.size * sizeof(sched->hv_tensor_backend_ids[0]));
    sched->hv_tensor_copies      = (ggml_tensor **) malloc(sched->hash_set.size * sched->n_backends * sched->n_copies * sizeof(struct ggml_tensor *));

    const size_t ggml_sched_max_splits = graph_size; // at most there is one split for each node in the graph
    const size_t nodes_size = graph_size + ggml_sched_max_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2;
    sched->node_backend_ids = (int *) calloc(nodes_size, sizeof(sched->node_backend_ids[0]));
    sched->leaf_backend_ids = (int *) calloc(nodes_size, sizeof(sched->leaf_backend_ids[0]));
    sched->prev_node_backend_ids = (int *) calloc(nodes_size, sizeof(sched->prev_node_backend_ids[0]));
    sched->prev_leaf_backend_ids = (int *) calloc(nodes_size, sizeof(sched->prev_leaf_backend_ids[0]));

    sched->context_buffer_size = ggml_sched_max_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sizeof(struct ggml_tensor) + ggml_graph_overhead_custom(graph_size, false);
    sched->context_buffer = (char *) malloc(sched->context_buffer_size);

    const int initial_splits_capacity = 16;
    sched->splits = (ggml_backend_sched_split *) calloc(initial_splits_capacity, sizeof(sched->splits[0]));
    sched->splits_capacity = initial_splits_capacity;

    for (int b = 0; b < n_backends; b++) {
        sched->backends[b] = backends[b];
        sched->bufts[b] = bufts ? bufts[b] : ggml_backend_get_default_buffer_type(backends[b]);
        GGML_ASSERT(ggml_backend_supports_buft(backends[b], sched->bufts[b]));

        if (sched->n_copies > 1) {
            for (int c = 0; c < sched->n_copies; c++) {
                sched->events[b][c] = ggml_backend_event_new(backends[b]->device);
            }
        }
    }

    sched->galloc = ggml_gallocr_new_n(sched->bufts, n_backends);

    ggml_backend_sched_reset(sched);

    return sched;
}